

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>,std::tr1::tuple<int,char_const*,__locale_struct*,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<int>,_testing::Matcher<const_char_*>,_testing::Matcher<__locale_struct_*>,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<int,_const_char_*,___locale_struct_*,_void,_void,_void,_void,_void,_void,_void>
               *values,ostream *os)

{
  char *s;
  MatcherInterface<const_char_*> *pMVar1;
  int iVar2;
  ostream *poVar3;
  type matcher;
  string local_1d0;
  StringMatchResultListener listener;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<int>,testing::Matcher<char_const*>,testing::Matcher<__locale_struct*>,void,void,void,void,void,void,void>,std::tr1::tuple<int,char_const*,__locale_struct*,void,void,void,void,void,void,void>>
            (matchers,values,os);
  Matcher<const_char_*>::Matcher(&matcher,&matchers->f1_);
  s = values->f1_;
  StringMatchResultListener::StringMatchResultListener(&listener);
  iVar2 = (*((matcher.super_MatcherBase<const_char_*>.impl_.value_)->super_MatcherDescriberInterface
            )._vptr_MatcherDescriberInterface[4])
                    (matcher.super_MatcherBase<const_char_*>.impl_.value_,s,&listener);
  if ((char)iVar2 == '\0') {
    poVar3 = std::operator<<(os,"  Expected arg #");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,": ");
    pMVar1 = (matchers->f1_).super_MatcherBase<const_char_*>.impl_.value_;
    (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
    std::operator<<(os,"\n           Actual: ");
    PrintTo(s,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<const_char_*>::~MatcherBase(&matcher.super_MatcherBase<const_char_*>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }